

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch_tests.cpp
# Opt level: O2

void __thiscall minisketch_tests::minisketch_test::test_method(minisketch_test *this)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  FastRandomContext *this_00;
  iterator in_R8;
  pointer in_R9;
  uint uVar9;
  long lVar10;
  uint32_t a;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar13;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  lazy_ostream local_d8;
  undefined1 *local_c8;
  char **local_c0;
  type sols;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  Minisketch sketch_c;
  Minisketch sketch_br;
  Minisketch sketch_ar;
  Minisketch sketch_b;
  Minisketch sketch_a;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> dec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  for (iVar7 = 0; iVar7 != 100; iVar7 = iVar7 + 1) {
    uVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,0xb);
    iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,1000000000);
    uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                      (&this_00->super_RandomMixin<FastRandomContext>,uVar2 + 1);
    iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,10000);
    uVar6 = iVar3 + uVar4 + 1;
    uVar9 = uVar6 + iVar5;
    ::node::MakeMinisketch32((node *)&sketch_a,10);
    uVar8 = (ulong)(iVar3 + 1);
    for (uVar11 = uVar8; uVar11 < uVar9; uVar11 = uVar11 + 1) {
      Minisketch::Add(&sketch_a,uVar11);
    }
    ::node::MakeMinisketch32((node *)&sketch_b,10);
    for (uVar11 = (ulong)uVar6; uVar11 < uVar9 + (uVar2 - uVar4); uVar11 = uVar11 + 1) {
      Minisketch::Add(&sketch_b,uVar11);
    }
    ::node::MakeMinisketch32((node *)&sketch_ar,10);
    ::node::MakeMinisketch32((node *)&sketch_br,10);
    Minisketch::Serialize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dec,&sketch_a);
    Minisketch::Deserialize<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (&sketch_ar,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dec,(type)0x0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dec);
    Minisketch::Serialize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dec,&sketch_b);
    Minisketch::Deserialize<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (&sketch_br,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dec,(type)0x0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dec);
    sketch_c = sketch_ar;
    sketch_ar.m_minisketch._M_t.super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>._M_t.
    super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
    super__Head_base<0UL,_minisketch_*,_false>._M_head_impl =
         (unique_ptr<minisketch,_Minisketch::Deleter>)
         (__uniq_ptr_data<minisketch,_Minisketch::Deleter,_true,_true>)0x0;
    Minisketch::Merge(&sketch_c,&sketch_br);
    Minisketch::Decode(&dec,&sketch_c,(ulong)uVar2);
    local_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/minisketch_tests.cpp"
    ;
    local_88 = "";
    local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_98 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar13 = 0x3d1377;
    file.m_end = (iterator)0x2c;
    file.m_begin = (iterator)&local_90;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
    sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           dec.
                           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           ._M_engaged);
    sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8 = "dec.has_value()";
    local_e0 = "";
    local_d8.m_empty = false;
    local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = &local_e8;
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/minisketch_tests.cpp"
    ;
    local_f0 = "";
    in_R8 = (iterator)0x2;
    in_R9 = (pointer)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sols,&local_d8,2,0,WARN,_cVar13,(size_t)&local_f8,0x2c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         dec.
         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start;
    sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         dec.
         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         dec.
         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    dec.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dec.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dec.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    for (lVar10 = 0; (ulong)uVar4 << 3 != lVar10; lVar10 = lVar10 + 8) {
      local_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/minisketch_tests.cpp"
      ;
      local_100 = "";
      local_118 = &boost::unit_test::basic_cstring<char_const>::null;
      local_110 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x2f;
      file_00.m_begin = (iterator)&local_108;
      msg_00.m_end = (iterator)in_R9;
      msg_00.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
                 msg_00);
      local_d8.m_empty = false;
      local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
      local_c8 = boost::unit_test::lazy_ostream::inst;
      local_c0 = (char **)0xc7f1cc;
      local_128 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/minisketch_tests.cpp"
      ;
      local_120 = "";
      in_R9 = (pointer)((long)sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar10);
      local_e8 = (char *)CONCAT44(local_e8._4_4_,(int)uVar8);
      in_R8 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (&local_d8,&local_128,0x2f,1,2,in_R9,"sols[i]",&local_e8,"start_a + i");
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    uVar11 = (ulong)(uVar2 - uVar4);
    while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
      local_138 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/minisketch_tests.cpp"
      ;
      local_130 = "";
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x30;
      file_01.m_begin = (iterator)&local_138;
      msg_01.m_end = (iterator)in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
                 msg_01);
      local_d8.m_empty = false;
      local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
      local_c8 = boost::unit_test::lazy_ostream::inst;
      local_c0 = (char **)0xc7f1cc;
      local_158 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/minisketch_tests.cpp"
      ;
      local_150 = "";
      in_R9 = sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + uVar4;
      local_e8 = (char *)CONCAT44(local_e8._4_4_,iVar3 + iVar5 + 1 + uVar4);
      in_R8 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (&local_d8,&local_158,0x30,1,2,in_R9,"sols[i + a_not_b]",&local_e8,
                 "start_b + both + i");
      uVar4 = uVar4 + 1;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&sols.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &dec);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_c.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_br.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_ar.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_b.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_a.m_minisketch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(minisketch_test)
{
    for (int i = 0; i < 100; ++i) {
        uint32_t errors = 0 + m_rng.randrange(11);
        uint32_t start_a = 1 + m_rng.randrange(1000000000);
        uint32_t a_not_b = m_rng.randrange(errors + 1);
        uint32_t b_not_a = errors - a_not_b;
        uint32_t both = m_rng.randrange(10000);
        uint32_t end_a = start_a + a_not_b + both;
        uint32_t start_b = start_a + a_not_b;
        uint32_t end_b = start_b + both + b_not_a;

        Minisketch sketch_a = MakeMinisketch32(10);
        for (uint32_t a = start_a; a < end_a; ++a) sketch_a.Add(a);
        Minisketch sketch_b = MakeMinisketch32(10);
        for (uint32_t b = start_b; b < end_b; ++b) sketch_b.Add(b);

        Minisketch sketch_ar = MakeMinisketch32(10);
        Minisketch sketch_br = MakeMinisketch32(10);
        sketch_ar.Deserialize(sketch_a.Serialize());
        sketch_br.Deserialize(sketch_b.Serialize());

        Minisketch sketch_c = std::move(sketch_ar);
        sketch_c.Merge(sketch_br);
        auto dec = sketch_c.Decode(errors);
        BOOST_REQUIRE(dec.has_value());
        auto sols = std::move(*dec);
        std::sort(sols.begin(), sols.end());
        for (uint32_t i = 0; i < a_not_b; ++i) BOOST_CHECK_EQUAL(sols[i], start_a + i);
        for (uint32_t i = 0; i < b_not_a; ++i) BOOST_CHECK_EQUAL(sols[i + a_not_b], start_b + both + i);
    }
}